

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

size_t cs_impl::
       hash_if<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_false>
       ::hash(deque<cs_impl::any,_std::allocator<cs_impl::any>_> *val)

{
  error *this;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  this = (error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"E000F",&local_29);
  cov::error::error(this,in_stack_ffffffffffffffa8);
  __cxa_throw(this,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

static std::size_t hash(const X &val)
		{
			throw cov::error("E000F");
		}